

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_wrapper.h
# Opt level: O0

optional<std::__cxx11::basic_string<char>_> * __thiscall
sqlite::get_col_from_db<std::__cxx11::string>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,sqlite *this,undefined4 param_3)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined4 local_24;
  sqlite *psStack_20;
  int inx_local;
  sqlite3_stmt *stmt_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_24 = param_3;
  psStack_20 = this;
  local_10 = __return_storage_ptr__;
  iVar1 = sqlite3_column_type(this,param_3);
  if (iVar1 == 5) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    get_col_from_db(&local_48,psStack_20,local_24);
    std::make_optional<std::__cxx11::string>(__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

inline optional<OptionalT> get_col_from_db(sqlite3_stmt* stmt, int inx, result_type<optional<OptionalT>>) {
		#ifdef MODERN_SQLITE_EXPERIMENTAL_OPTIONAL_SUPPORT
		if(sqlite3_column_type(stmt, inx) == SQLITE_NULL) {
			return std::experimental::nullopt;
		}
		return std::experimental::make_optional(get_col_from_db(stmt, inx, result_type<OptionalT>()));
		#else
		if(sqlite3_column_type(stmt, inx) == SQLITE_NULL) {
			return std::nullopt;
		}
		return std::make_optional(get_col_from_db(stmt, inx, result_type<OptionalT>()));
		#endif
	}